

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
argsman_tests::ArgsMergeTestingSetup::GetValues
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ArgsMergeTestingSetup *this,ActionList *actions,string *section,
          string *name,string *value_prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer pcVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  undefined8 uVar11;
  long in_FS_OFFSET;
  int suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  int local_11c;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_11c = 0;
  paVar1 = &local_b8.field_2;
  paVar2 = &local_98.field_2;
  lVar7 = 0;
  do {
    uVar3 = *(uint *)((long)*actions + lVar7);
    if (uVar3 == 0) break;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    if (uVar3 - 3 < 2) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      pcVar4 = (section->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar4,pcVar4 + section->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_78,".");
      GetValues();
    }
    if ((uVar3 & 0xfffffffd) == 1) {
      bVar5 = true;
      do {
        bVar10 = bVar5;
        std::operator+(&local_f8,&local_58,name);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_f8,"=");
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar6->_M_dataplus)._M_p;
        paVar8 = &pbVar6->field_2;
        if (paVar9 == paVar8) {
          local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_d8._M_dataplus._M_p = (pointer)paVar9;
        }
        local_d8._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_d8,(value_prefix->_M_dataplus)._M_p,value_prefix->_M_string_length
                          );
        local_b8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar9) {
          local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        local_11c = local_11c + 1;
        util::ToString<int>(&local_118,&local_11c);
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          uVar11 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_118._M_string_length + local_b8._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            uVar11 = local_118.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_118._M_string_length + local_b8._M_string_length)
          goto LAB_0029229f;
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_118,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        }
        else {
LAB_0029229f:
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_b8,local_118._M_dataplus._M_p,local_118._M_string_length);
        }
        local_98._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == paVar9) {
          local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_98._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_98._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
      } while (bVar10);
    }
    if ((uVar3 == 4) || (uVar3 == 2)) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_58._M_dataplus._M_p,
                 local_58._M_dataplus._M_p + local_58._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_d8,"no");
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_d8,(name->_M_dataplus)._M_p,name->_M_string_length);
      local_b8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar9 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar9) {
        local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b8,"=1");
      local_98._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar9 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar9) {
        local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_98._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_98._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetValues(const ActionList& actions,
        const std::string& section,
        const std::string& name,
        const std::string& value_prefix)
    {
        std::vector<std::string> values;
        int suffix = 0;
        for (Action action : actions) {
            if (action == NONE) break;
            std::string prefix;
            if (action == SECTION_SET || action == SECTION_NEGATE) prefix = section + ".";
            if (action == SET || action == SECTION_SET) {
                for (int i = 0; i < 2; ++i) {
                    values.push_back(prefix + name + "=" + value_prefix + ToString(++suffix));
                }
            }
            if (action == NEGATE || action == SECTION_NEGATE) {
                values.push_back(prefix + "no" + name + "=1");
            }
        }
        return values;
    }